

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

char * duckdb::NumericHelper::FormatUnsigned<unsigned_char>(uchar value,char *ptr)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  
  if (value < 100) {
    uVar3 = (uint)value;
    if (9 < value) {
      uVar3 = NumericCastImpl<unsigned_int,_int,_false>::Convert(uVar3 * 2);
      ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar3 + 1];
      ptr[-2] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar3];
      return ptr + -2;
    }
  }
  else {
    uVar3 = (uint)value * 0x29 >> 0xc;
    uVar2 = NumericCastImpl<unsigned_int,_int,_false>::Convert
                      ((uint)(byte)((value + (char)uVar3 * -100) * '\x02'));
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2 + 1];
    ptr[-2] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
    ptr = ptr + -2;
  }
  cVar1 = NumericCastImpl<char,_int,_false>::Convert(uVar3 | 0x30);
  ptr[-1] = cVar1;
  return ptr + -1;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}